

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O3

float __thiscall LumaQuantizer::quantize(LumaQuantizer *this,float val,uint ch)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  undefined4 extraout_XMM0_Db;
  uint in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  uint in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint in_XMM3_Dc;
  uint in_XMM3_Dd;
  
  if ((ch == 0) || ((this->m_colorSpace | CS_YCBCR) == CS_XYZ)) {
    uVar3 = this->m_maxVal;
    uVar5 = 0;
    pfVar1 = this->m_mapping;
    if (1 < (int)uVar3) {
      uVar5 = 0;
      do {
        uVar4 = uVar5 + uVar3 >> 1;
        if (val < pfVar1[uVar4]) {
          uVar3 = uVar4;
          uVar4 = uVar5;
        }
        uVar5 = uVar4;
      } while ((int)(uVar5 + 1) < (int)uVar3);
    }
    uVar4 = -(uint)(val - pfVar1[uVar5] < pfVar1[(int)uVar3] - val);
    auVar7._0_4_ = ~uVar4 & (uint)(float)(int)uVar3;
    auVar7._4_4_ = 0;
    auVar7._8_4_ = ~in_XMM0_Dc & in_XMM3_Dc;
    auVar7._12_4_ = ~in_XMM0_Dd & in_XMM3_Dd;
    auVar8 = auVar7 | ZEXT416((uint)(float)uVar5 & uVar4);
  }
  else {
    auVar9._0_4_ = (float)this->m_maxValColor;
    fVar6 = floorf(val * auVar9._0_4_ + 0.5);
    auVar8._4_4_ = extraout_XMM0_Db;
    auVar8._0_4_ = fVar6;
    auVar8._8_4_ = extraout_XMM0_Dc;
    auVar8._12_4_ = extraout_XMM0_Dd;
    if (auVar9._0_4_ <= fVar6) {
      auVar9._4_12_ = auVar8._4_12_;
      auVar8 = auVar9;
    }
    if (auVar8._0_4_ <= 0.0) {
      auVar2._12_4_ = 0;
      auVar2._0_12_ = auVar8._4_12_;
      auVar8 = auVar2 << 0x20;
    }
  }
  return auVar8._0_4_;
}

Assistant:

float LumaQuantizer::quantize(const float val, const unsigned int ch) const
{
    float res;
    
	if (ch == 0 || m_colorSpace == CS_RGB || m_colorSpace == CS_XYZ)
    {
	    //binary search for best fitting luminance
	    int l = 0, r = m_maxVal;
	    while( l+1 < r )
	    {
		    int m = (l+r)/2;
		    if( val < m_mapping[m] )
			    r = m;
		    else
			    l = m;
	    }
	    //assert( r - l == 1 );
	    if ( val - m_mapping[l] < m_mapping[r] - val )
		    res = (float)l;
	    else
		    res = (float)r;
	}
	else
	{
	    res = floor(m_maxValColor*val + 0.5f);
        res = std::max(0.0f, std::min((float)m_maxValColor, res));
    }
	
	return res;
}